

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O2

void __thiscall wasm::Vacuum::visitTry(Vacuum *this,Try *curr)

{
  bool bVar1;
  Nop *output;
  EffectAnalyzer local_190;
  
  EffectAnalyzer::EffectAnalyzer
            (&local_190,
             &((this->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_Pass.runner)->options,
             (this->
             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
             ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
             super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
             super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule,curr->body);
  EffectAnalyzer::~EffectAnalyzer(&local_190);
  if ((local_190.throws_ == false) &&
     (local_190.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               curr->body);
  }
  else if (((curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id == 0
           ) && ((curr->catchBodies).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                 usedElements -
                 (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                 usedElements == 1)) {
    EffectAnalyzer::EffectAnalyzer
              (&local_190,
               &((this->
                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                 ).super_Pass.runner)->options,
               (this->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
               super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
               super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule,
               (Expression *)curr);
    bVar1 = EffectAnalyzer::hasUnremovableSideEffects(&local_190);
    EffectAnalyzer::~EffectAnalyzer(&local_190);
    if (!bVar1) {
      (curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression._id = NopId;
      (curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id = 0;
    }
  }
  return;
}

Assistant:

void visitTry(Try* curr) {
    // If try's body does not throw, the whole try-catch can be replaced with
    // the try's body.
    if (!EffectAnalyzer(getPassOptions(), *getModule(), curr->body).throws()) {
      replaceCurrent(curr->body);
      return;
    }

    // The try's body does throw. However, throwing may be the only thing it
    // does, and if the try has a catch-all, then the entire try including
    // children may have no effects. Note that this situation can only happen
    // if we do have a catch-all, so avoid wasted work by checking that first.
    // Also, we can't do this if a result is returned, so check the type.
    if (curr->type == Type::none && curr->hasCatchAll() &&
        !EffectAnalyzer(getPassOptions(), *getModule(), curr)
           .hasUnremovableSideEffects()) {
      ExpressionManipulator::nop(curr);
    }
  }